

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enum.hpp
# Opt level: O2

void Reflection::Enum::declare<Configurable::Display>(char *name,char *declaration)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  allocator<char> local_99;
  pointer local_98;
  size_type local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._16_8_ = name;
  while (*declaration != '\0') {
    iVar2 = isalpha((int)*declaration);
    if (iVar2 == 0) {
      declaration = declaration + 1;
    }
    else {
      pcVar3 = declaration + -1;
      do {
        cVar1 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
        iVar2 = isalpha((int)cVar1);
      } while ((int)cVar1 - 0x30U < 10 || iVar2 != 0);
      local_78 = (undefined1  [8])(local_70 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,declaration,pcVar3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      declaration = pcVar3;
    }
  }
  local_78 = (undefined1  [8])&Configurable::Display::typeinfo;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_70,&local_48);
  std::
  _Hashtable<std::type_index,std::pair<std::type_index_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::type_index_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Select1st,std::equal_to<std::type_index>,std::hash<std::type_index>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<std::type_index,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&members_by_type__abi_cxx11_,local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,(char *)local_60._16_8_,&local_99);
  local_70._0_8_ = local_60;
  local_78 = (undefined1  [8])&Configurable::Display::typeinfo;
  if (local_98 == (pointer)local_88) {
    local_60._8_4_ = local_88._8_4_;
    local_60._12_4_ = local_88._12_4_;
  }
  else {
    local_70._0_8_ = local_98;
  }
  local_70._8_8_ = local_90;
  local_90 = 0;
  local_88._0_4_ = local_88._0_4_ & 0xffffff00;
  local_98 = (pointer)local_88;
  std::
  _Hashtable<std::type_index,std::pair<std::type_index_const,std::__cxx11::string>,std::allocator<std::pair<std::type_index_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::type_index>,std::hash<std::type_index>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<std::type_index,std::__cxx11::string>>(&names_by_type__abi_cxx11_,local_78)
  ;
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

static void declare(const char *name, const char *declaration) {
			const char *d_ptr = declaration;

			std::vector<std::string> result;
			while(true) {
				// Skip non-alphas, and exit if the terminator is found.
				while(*d_ptr && !isalpha(*d_ptr)) ++d_ptr;
				if(!*d_ptr) break;

				// Note the current location and proceed for all alphas and digits.
				const auto start = d_ptr;
				while(isalpha(*d_ptr) || isdigit(*d_ptr)) ++d_ptr;

				// Add a string view.
				result.emplace_back(std::string(start, size_t(d_ptr - start)));
			}

			members_by_type_.emplace(std::make_pair(std::type_index(typeid(Type)), result));
			names_by_type_.emplace(std::make_pair(std::type_index(typeid(Type)), std::string(name)));
		}